

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::ReadLogicalExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                  *this,int opcode)

{
  LogicalExpr arg;
  int opcode_00;
  OpCodeInfo *pOVar1;
  ExprBase condition_00;
  int in_ESI;
  ExprBase in_RDI;
  PairwiseArgHandler args_3;
  int num_args_1;
  LogicalArgHandler args_2;
  int num_args;
  LogicalExpr else_expr;
  LogicalExpr then_expr;
  LogicalExpr condition;
  char c;
  NumericExpr lhs;
  BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>::NumericExprReader>
  args_1;
  BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>::LogicalExprReader>
  args;
  Kind kind;
  OpCodeInfo *info;
  undefined8 in_stack_fffffffffffffee8;
  ArgHandler *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *in_stack_ffffffffffffff00;
  Kind kind_00;
  ExprBase in_stack_ffffffffffffff08;
  CStringRef in_stack_ffffffffffffff20;
  BasicCStringRef<char> local_88;
  char local_79;
  ExprBase local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  ExprBase local_30;
  Kind local_24;
  OpCodeInfo *local_20;
  ExprBase local_8;
  
  local_20 = GetOpCodeInfo(in_ESI);
  local_24 = local_20->kind;
  condition_00.impl_._4_4_ = 0;
  condition_00.impl_._0_4_ = local_20->first_kind - NOT;
  switch(condition_00.impl_) {
  case (Impl *)0x0:
    local_30.impl_ =
         (Impl *)ReadLogicalExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                                  *)condition_00.impl_);
    arg.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffefc;
    arg.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffef8;
    local_8.impl_ =
         (Impl *)NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                 ::OnNot((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                          *)in_stack_fffffffffffffef0,arg);
    break;
  case (Impl *)0x1:
    BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>::LogicalExprReader>
    ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>::LogicalExprReader>
                       *)in_stack_ffffffffffffff00,
                      (NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_48 = local_40;
    local_50 = local_38;
    local_8.impl_ =
         (Impl *)NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                 ::OnBinaryLogical((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                                    *)in_stack_ffffffffffffff08.impl_,
                                   (Kind)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                                   (LogicalExpr)condition_00.impl_,(LogicalExpr)in_RDI.impl_);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffff20,
               "expected logical expression opcode");
    TextReader<fmt::Locale>::ReportError<>
              ((TextReader<fmt::Locale> *)condition_00.impl_,in_stack_ffffffffffffff20);
    BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)0x1acd24);
    break;
  case (Impl *)0x4:
    BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>::NumericExprReader>
    ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>::NumericExprReader>
                       *)in_stack_ffffffffffffff00,
                      (NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_68 = local_60;
    local_70 = local_58;
    local_8.impl_ =
         (Impl *)NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                 ::OnRelational((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                                 *)in_stack_ffffffffffffff08.impl_,
                                (Kind)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                                (NumericExpr)condition_00.impl_,(NumericExpr)in_RDI.impl_);
    break;
  case (Impl *)0xa:
    local_78.impl_ =
         (Impl *)ReadNumericExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                 SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0));
    local_79 = ReaderBase::ReadChar(*(ReaderBase **)in_RDI.impl_);
    if (local_79 == 'o') {
      opcode_00 = ReadOpCode(in_stack_ffffffffffffff00);
      kind_00 = (Kind)((ulong)in_stack_ffffffffffffff00 >> 0x20);
      pOVar1 = GetOpCodeInfo(opcode_00);
      if (pOVar1->kind != COUNT) goto LAB_001acb2b;
    }
    else {
LAB_001acb2b:
      kind_00 = (Kind)((ulong)*(undefined8 *)in_RDI.impl_ >> 0x20);
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_88,"expected count expression");
      TextReader<fmt::Locale>::ReportError<>
                ((TextReader<fmt::Locale> *)condition_00.impl_,in_stack_ffffffffffffff20);
    }
    ReadCountExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                   *)CONCAT44(local_24,in_stack_fffffffffffffef8));
    local_8.impl_ =
         (Impl *)NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                 ::OnLogicalCount((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                                   *)in_stack_ffffffffffffff08.impl_,kind_00,
                                  (NumericExpr)condition_00.impl_,(CountExpr)in_RDI.impl_);
    break;
  case (Impl *)0x10:
    ReadLogicalExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                     *)condition_00.impl_);
    ReadLogicalExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                     *)condition_00.impl_);
    ReadLogicalExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                     *)condition_00.impl_);
    local_8.impl_ =
         (Impl *)NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                 ::OnImplication((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                                  *)in_stack_ffffffffffffff00,(LogicalExpr)condition_00.impl_,
                                 (LogicalExpr)in_RDI.impl_,
                                 (LogicalExpr)in_stack_ffffffffffffff08.impl_);
    break;
  case (Impl *)0x11:
    ReadNumArgs(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
    ::BeginIteratedLogical
              ((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                *)in_stack_fffffffffffffef0,(Kind)((ulong)in_stack_fffffffffffffee8 >> 0x20),
               (int)in_stack_fffffffffffffee8);
    NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
    ::
    ReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>::ArgHandler>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
    local_8.impl_ =
         (Impl *)NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                 ::EndIteratedLogical
                           (*(NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                              **)(in_RDI.impl_ + 4));
    break;
  case (Impl *)0x13:
    ReadNumArgs(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
    ::BeginPairwise((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                     *)in_stack_fffffffffffffef0,(Kind)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                    (int)in_stack_fffffffffffffee8);
    NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
    ::
    ReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>::ArgHandler>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
    local_8.impl_ =
         (Impl *)NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                 ::EndPairwise(*(NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                                 **)(in_RDI.impl_ + 4));
  }
  return (LogicalExpr)(ExprBase)local_8.impl_;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}